

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getTransferMethodStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TransferMethod method,
          bool isDescription)

{
  char cVar1;
  ctype *pcVar2;
  long lVar3;
  size_type ndx;
  ulong uVar4;
  char cVar5;
  char *pcVar6;
  locale loc;
  ostringstream desc;
  char local_1b9;
  locale local_1b8 [8];
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::locale::locale(local_1b8);
  cVar5 = (char)method;
  switch((ulong)this & 0xffffffff) {
  case 0:
    lVar3 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if (lVar3 == 4 && cVar5 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "COPY_BUFFER"[lVar3];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xb);
    break;
  case 1:
    lVar3 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if (lVar3 == 4 && cVar5 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "COPY_IMAGE"[lVar3];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    break;
  case 2:
    lVar3 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if (lVar3 == 4 && cVar5 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "BLIT_IMAGE"[lVar3];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    break;
  case 3:
    uVar4 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if ((cVar5 == '\0') || ((0x4810UL >> (uVar4 & 0x3f) & 1) == 0)) {
        cVar1 = "COPY_BUFFER_TO_IMAGE"[uVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x14);
    break;
  case 4:
    uVar4 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if ((cVar5 == '\0') || ((0x2410UL >> (uVar4 & 0x3f) & 1) == 0)) {
        cVar1 = "COPY_IMAGE_TO_BUFFER"[uVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x14);
    break;
  case 5:
    lVar3 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if (lVar3 == 6 && cVar5 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "UPDATE_BUFFER"[lVar3];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xd);
    break;
  case 6:
    lVar3 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if (lVar3 == 4 && cVar5 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "FILL_BUFFER"[lVar3];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xb);
    break;
  case 7:
    lVar3 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if ((cVar5 == '\0') || ((lVar3 != 0xb && (lVar3 != 5)))) {
        cVar1 = "CLEAR_COLOR_IMAGE"[lVar3];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x11);
    break;
  case 8:
    uVar4 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if ((cVar5 == '\0') || ((0x80820UL >> (uVar4 & 0x3f) & 1) == 0)) {
        cVar1 = "CLEAR_DEPTH_STENCIL_IMAGE"[uVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x19);
    break;
  case 9:
    lVar3 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if (lVar3 == 7 && cVar5 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "RESOLVE_IMAGE"[lVar3];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xd);
    break;
  case 10:
    uVar4 = 0;
    local_1b0 = __return_storage_ptr__;
    do {
      if ((cVar5 == '\0') || ((0x8410UL >> (uVar4 & 0x3f) & 1) == 0)) {
        cVar1 = "COPY_QUERY_POOL_RESULTS"[uVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b8);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x17);
    break;
  default:
    lVar3 = 0xf;
    pcVar6 = "unknown method!";
    goto LAB_00474003;
  }
  pcVar6 = "_";
  if (cVar5 != '\0') {
    pcVar6 = " ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,1);
  lVar3 = 6;
  pcVar6 = "method";
  __return_storage_ptr__ = local_1b0;
LAB_00474003:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar3);
  std::__cxx11::stringbuf::str();
  std::locale::~locale(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string getTransferMethodStr(const TransferMethod method,
								 bool                 isDescription)
{
	std::ostringstream desc;
	std::locale loc;
	switch(method)
	{
#define METHOD_CASE(p)                             \
		case TRANSFER_METHOD_##p:                  \
		{                                          \
			GEN_DESC_STRING(p, method);            \
			break;                                 \
		}
	  METHOD_CASE(COPY_BUFFER)
	  METHOD_CASE(COPY_IMAGE)
	  METHOD_CASE(BLIT_IMAGE)
	  METHOD_CASE(COPY_BUFFER_TO_IMAGE)
	  METHOD_CASE(COPY_IMAGE_TO_BUFFER)
	  METHOD_CASE(UPDATE_BUFFER)
	  METHOD_CASE(FILL_BUFFER)
	  METHOD_CASE(CLEAR_COLOR_IMAGE)
	  METHOD_CASE(CLEAR_DEPTH_STENCIL_IMAGE)
	  METHOD_CASE(RESOLVE_IMAGE)
	  METHOD_CASE(COPY_QUERY_POOL_RESULTS)
#undef METHOD_CASE
	  default:
		desc << "unknown method!";
		DE_FATAL("Unknown method!");
		break;
	};

	return desc.str();
}